

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtsp.c
# Opt level: O1

CURLcode Curl_rtsp_parseheader(connectdata *conn,char *header)

{
  Curl_easy *data;
  bool bVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  CURLcode CVar6;
  char *__s1;
  long CSeq;
  long local_30;
  
  data = conn->data;
  local_30 = 0;
  iVar3 = curl_strnequal("CSeq:",header,5);
  if (iVar3 != 0) {
    iVar3 = __isoc99_sscanf(header + 4,": %ld",&local_30);
    if (iVar3 == 1) {
      *(long *)((long)(data->req).protop + 0x230) = local_30;
      (data->state).rtsp_CSeq_recv = local_30;
      return CURLE_OK;
    }
    Curl_failf(data,"Unable to read the CSeq header: [%s]",header);
    return CURLE_RTSP_CSEQ_ERROR;
  }
  iVar3 = curl_strnequal("Session:",header,8);
  if (iVar3 == 0) {
    return CURLE_OK;
  }
  bVar2 = header[8];
  __s1 = header + 8;
  while ((bVar2 != 0 && (iVar3 = Curl_isspace((uint)bVar2), iVar3 != 0))) {
    bVar2 = __s1[1];
    __s1 = __s1 + 1;
  }
  if (*__s1 == '\0') {
    Curl_failf(data,"Got a blank Session ID");
  }
  else {
    pcVar5 = (data->set).str[0x32];
    if (pcVar5 == (char *)0x0) {
      sVar4 = 0;
      while (((bVar2 = __s1[sVar4], bVar2 != 0 && (bVar2 != 0x3b)) &&
             (iVar3 = Curl_isspace((uint)bVar2), iVar3 == 0))) {
        sVar4 = sVar4 + 1;
      }
      pcVar5 = (char *)(*Curl_cmalloc)(sVar4 + 1);
      (data->set).str[0x32] = pcVar5;
      CVar6 = CURLE_OUT_OF_MEMORY;
      if (pcVar5 == (char *)0x0) {
        bVar1 = false;
      }
      else {
        memcpy(pcVar5,__s1,sVar4);
        (data->set).str[0x32][sVar4] = '\0';
        bVar1 = true;
      }
      goto LAB_00138523;
    }
    sVar4 = strlen(pcVar5);
    iVar3 = strncmp(__s1,pcVar5,sVar4);
    if (iVar3 != 0) {
      bVar1 = false;
      Curl_failf(data,"Got RTSP Session ID Line [%s], but wanted ID [%s]",__s1,pcVar5);
      CVar6 = CURLE_RTSP_SESSION_ERROR;
      goto LAB_00138523;
    }
  }
  bVar1 = true;
  CVar6 = CURLE_OUT_OF_MEMORY;
LAB_00138523:
  if (bVar1) {
    return CURLE_OK;
  }
  return CVar6;
}

Assistant:

CURLcode Curl_rtsp_parseheader(struct connectdata *conn,
                               char *header)
{
  struct Curl_easy *data = conn->data;
  long CSeq = 0;

  if(checkprefix("CSeq:", header)) {
    /* Store the received CSeq. Match is verified in rtsp_done */
    int nc = sscanf(&header[4], ": %ld", &CSeq);
    if(nc == 1) {
      struct RTSP *rtsp = data->req.protop;
      rtsp->CSeq_recv = CSeq; /* mark the request */
      data->state.rtsp_CSeq_recv = CSeq; /* update the handle */
    }
    else {
      failf(data, "Unable to read the CSeq header: [%s]", header);
      return CURLE_RTSP_CSEQ_ERROR;
    }
  }
  else if(checkprefix("Session:", header)) {
    char *start;

    /* Find the first non-space letter */
    start = header + 8;
    while(*start && ISSPACE(*start))
      start++;

    if(!*start) {
      failf(data, "Got a blank Session ID");
    }
    else if(data->set.str[STRING_RTSP_SESSION_ID]) {
      /* If the Session ID is set, then compare */
      if(strncmp(start, data->set.str[STRING_RTSP_SESSION_ID],
                 strlen(data->set.str[STRING_RTSP_SESSION_ID]))  != 0) {
        failf(data, "Got RTSP Session ID Line [%s], but wanted ID [%s]",
              start, data->set.str[STRING_RTSP_SESSION_ID]);
        return CURLE_RTSP_SESSION_ERROR;
      }
    }
    else {
      /* If the Session ID is not set, and we find it in a response, then set
       * it.
       *
       * Allow any non whitespace content, up to the field separator or end of
       * line. RFC 2326 isn't 100% clear on the session ID and for example
       * gstreamer does url-encoded session ID's not covered by the standard.
       */
      char *end = start;
      while(*end && *end != ';' && !ISSPACE(*end))
        end++;

      /* Copy the id substring into a new buffer */
      data->set.str[STRING_RTSP_SESSION_ID] = malloc(end - start + 1);
      if(data->set.str[STRING_RTSP_SESSION_ID] == NULL)
        return CURLE_OUT_OF_MEMORY;
      memcpy(data->set.str[STRING_RTSP_SESSION_ID], start, end - start);
      (data->set.str[STRING_RTSP_SESSION_ID])[end - start] = '\0';
    }
  }
  return CURLE_OK;
}